

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool duckdb_snappy::InternalUncompress<duckdb_snappy::SnappyDecompressionValidator>
               (Source *r,SnappyDecompressionValidator *writer)

{
  bool bVar1;
  uint32_t uncompressed_len;
  SnappyDecompressor decompressor;
  uint32_t local_44;
  SnappyDecompressor local_40;
  
  local_40.peeked_ = 0;
  local_40.eof_ = false;
  local_40.ip_ = (char *)0x0;
  local_40.ip_limit_ = (char *)0x0;
  local_44 = 0;
  local_40.reader_ = r;
  bVar1 = SnappyDecompressor::ReadUncompressedLength(&local_40,&local_44);
  if (bVar1) {
    (*r->_vptr_Source[2])(r);
    writer->expected_ = (ulong)local_44;
    SnappyDecompressor::DecompressAllTags<duckdb_snappy::SnappyDecompressionValidator>
              (&local_40,writer);
    if (local_40.eof_ == true) {
      bVar1 = writer->expected_ == writer->produced_;
      goto LAB_011171f5;
    }
  }
  bVar1 = false;
LAB_011171f5:
  (*(local_40.reader_)->_vptr_Source[4])(local_40.reader_,(ulong)local_40.peeked_);
  return bVar1;
}

Assistant:

static bool InternalUncompress(Source* r, Writer* writer) {
  // Read the uncompressed length from the front of the compressed input
  SnappyDecompressor decompressor(r);
  uint32_t uncompressed_len = 0;
  if (!decompressor.ReadUncompressedLength(&uncompressed_len)) return false;

  return InternalUncompressAllTags(&decompressor, writer, r->Available(),
                                   uncompressed_len);
}